

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintNumberByStyle(UNITY_INT number,UNITY_DISPLAY_STYLE_T style)

{
  uint uVar1;
  int __c;
  byte bVar2;
  ulong uVar3;
  
  if ((style & 0x10) == 0) {
    if ((style & 0x20) != 0) {
      UnityPrintNumberUnsigned(number);
      return;
    }
    putchar(0x30);
    putchar(0x78);
    UnityPrintNumberHex(number,(char)style * '\x02' & 0x1e);
    return;
  }
  if (style != UNITY_DISPLAY_STYLE_CHAR) {
    UnityPrintNumber(number);
    return;
  }
  putchar(0x27);
  if (0x5e < number - 0x20U) {
    putchar(0x5c);
    if (number == 0xd) {
      number = 0x72;
    }
    else {
      if (number != 10) {
        putchar(0x78);
        uVar3 = 3;
        bVar2 = 4;
        do {
          uVar1 = (uint)((ulong)number >> (bVar2 & 0x3f)) & 0xf;
          __c = uVar1 + 0x30;
          if (9 < uVar1) {
            __c = uVar1 + 0x37;
          }
          putchar(__c);
          uVar3 = uVar3 - 1;
          bVar2 = bVar2 - 4;
        } while (1 < uVar3);
        goto LAB_00105b96;
      }
      number = 0x6e;
    }
  }
  putchar((int)number);
LAB_00105b96:
  putchar(0x27);
  return;
}

Assistant:

void UnityPrintNumberByStyle(const UNITY_INT number, const UNITY_DISPLAY_STYLE_T style)
{
    if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
    {
        if (style == UNITY_DISPLAY_STYLE_CHAR)
        {
            /* printable characters plus CR & LF are printed */
            UNITY_OUTPUT_CHAR('\'');
            if ((number <= 126) && (number >= 32))
            {
                UNITY_OUTPUT_CHAR((int)number);
            }
            /* write escaped carriage returns */
            else if (number == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (number == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('x');
                UnityPrintNumberHex((UNITY_UINT)number, 2);
            }
            UNITY_OUTPUT_CHAR('\'');
        }
        else
        {
            UnityPrintNumber(number);
        }
    }
    else if ((style & UNITY_DISPLAY_RANGE_UINT) == UNITY_DISPLAY_RANGE_UINT)
    {
        UnityPrintNumberUnsigned((UNITY_UINT)number);
    }
    else
    {
        UNITY_OUTPUT_CHAR('0');
        UNITY_OUTPUT_CHAR('x');
        UnityPrintNumberHex((UNITY_UINT)number, (char)((style & 0xF) * 2));
    }
}